

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O3

UBool timeZone_cleanup(void)

{
  if (DEFAULT_ZONE != (TimeZone *)0x0) {
    (*(DEFAULT_ZONE->super_UObject)._vptr_UObject[1])();
  }
  DEFAULT_ZONE = (TimeZone *)0x0;
  LOCK();
  gDefaultZoneInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  if (_GMT != (TimeZone *)0x0) {
    (*(_GMT->super_UObject)._vptr_UObject[1])();
  }
  _GMT = (TimeZone *)0x0;
  if (_UNKNOWN_ZONE != (TimeZone *)0x0) {
    (*(_UNKNOWN_ZONE->super_UObject)._vptr_UObject[1])();
  }
  _UNKNOWN_ZONE = (TimeZone *)0x0;
  LOCK();
  gStaticZonesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  TZDATA_VERSION[0] = '\0';
  TZDATA_VERSION[1] = '\0';
  TZDATA_VERSION[2] = '\0';
  TZDATA_VERSION[3] = '\0';
  TZDATA_VERSION[4] = '\0';
  TZDATA_VERSION[5] = '\0';
  TZDATA_VERSION[6] = '\0';
  TZDATA_VERSION[7] = '\0';
  TZDATA_VERSION[8] = '\0';
  TZDATA_VERSION[9] = '\0';
  TZDATA_VERSION[10] = '\0';
  TZDATA_VERSION[0xb] = '\0';
  TZDATA_VERSION[0xc] = '\0';
  TZDATA_VERSION[0xd] = '\0';
  TZDATA_VERSION[0xe] = '\0';
  TZDATA_VERSION[0xf] = '\0';
  LOCK();
  gTZDataVersionInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  LEN_SYSTEM_ZONES = 0;
  uprv_free_63(MAP_SYSTEM_ZONES);
  MAP_SYSTEM_ZONES = (int32_t *)0x0;
  LOCK();
  gSystemZonesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  LEN_CANONICAL_SYSTEM_ZONES = 0;
  uprv_free_63(MAP_CANONICAL_SYSTEM_ZONES);
  MAP_CANONICAL_SYSTEM_ZONES = (int32_t *)0x0;
  LOCK();
  gCanonicalZonesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  LEN_CANONICAL_SYSTEM_LOCATION_ZONES = 0;
  uprv_free_63(MAP_CANONICAL_SYSTEM_LOCATION_ZONES);
  MAP_CANONICAL_SYSTEM_LOCATION_ZONES = (int32_t *)0x0;
  LOCK();
  gCanonicalLocationZonesInitOnce.fState.super___atomic_base<int>._M_i = (__atomic_base<int>)0;
  UNLOCK();
  return '\x01';
}

Assistant:

U_CDECL_BEGIN
static UBool U_CALLCONV timeZone_cleanup(void)
{
    U_NAMESPACE_USE
    delete DEFAULT_ZONE;
    DEFAULT_ZONE = NULL;
    gDefaultZoneInitOnce.reset();

    delete _GMT;
    _GMT = NULL;
    delete _UNKNOWN_ZONE;
    _UNKNOWN_ZONE = NULL;
    gStaticZonesInitOnce.reset();

    uprv_memset(TZDATA_VERSION, 0, sizeof(TZDATA_VERSION));
    gTZDataVersionInitOnce.reset();

    LEN_SYSTEM_ZONES = 0;
    uprv_free(MAP_SYSTEM_ZONES);
    MAP_SYSTEM_ZONES = 0;
    gSystemZonesInitOnce.reset();

    LEN_CANONICAL_SYSTEM_ZONES = 0;
    uprv_free(MAP_CANONICAL_SYSTEM_ZONES);
    MAP_CANONICAL_SYSTEM_ZONES = 0;
    gCanonicalZonesInitOnce.reset();

    LEN_CANONICAL_SYSTEM_LOCATION_ZONES = 0;
    uprv_free(MAP_CANONICAL_SYSTEM_LOCATION_ZONES);
    MAP_CANONICAL_SYSTEM_LOCATION_ZONES = 0;
    gCanonicalLocationZonesInitOnce.reset();

    return TRUE;
}